

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O1

void __thiscall gjkepa2_impl::GJK::getsupport(GJK *this,btVector3 *d,sSV *sv)

{
  undefined1 auVar1 [16];
  code *pcVar2;
  long *plVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined8 uVar7;
  
  fVar4 = d->m_floats[2] * d->m_floats[2] +
          d->m_floats[0] * d->m_floats[0] + d->m_floats[1] * d->m_floats[1];
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar4 = 1.0 / fVar4;
  auVar10._0_4_ = fVar4 * (float)*(undefined8 *)d->m_floats;
  auVar10._4_4_ = fVar4 * (float)((ulong)*(undefined8 *)d->m_floats >> 0x20);
  fVar4 = fVar4 * d->m_floats[2];
  auVar10._8_4_ = fVar4;
  auVar10._12_4_ = 0;
  *(undefined1 (*) [16])(sv->d).m_floats = auVar10;
  pcVar2 = (code *)(this->m_shape).Ls;
  plVar3 = (long *)((long)&((this->m_shape).m_shapes[0]->super_btCollisionShape).
                           _vptr_btCollisionShape + *(long *)&(this->m_shape).field_0x88);
  if (((ulong)pcVar2 & 1) != 0) {
    pcVar2 = *(code **)(pcVar2 + *plVar3 + -1);
  }
  uVar6 = (*pcVar2)(plVar3,sv);
  pcVar2 = (code *)(this->m_shape).Ls;
  if (((ulong)pcVar2 & 1) != 0) {
    pcVar2 = *(code **)(pcVar2 + *(long *)((long)&((this->m_shape).m_shapes[1]->
                                                  super_btCollisionShape)._vptr_btCollisionShape +
                                          *(long *)&(this->m_shape).field_0x88) + -1);
  }
  fVar9 = (sv->d).m_floats[1] * (this->m_shape).m_toshape1.m_el[2].m_floats[1];
  uVar7 = (*pcVar2)();
  fVar8 = (float)((ulong)uVar7 >> 0x20);
  fVar5 = (float)uVar7;
  uVar7 = *(undefined8 *)(this->m_shape).m_toshape0.m_origin.m_floats;
  auVar1._4_4_ = (float)((ulong)uVar6 >> 0x20) -
                 ((float)((ulong)uVar7 >> 0x20) +
                 (this->m_shape).m_toshape0.m_basis.m_el[1].m_floats[2] * fVar9 +
                 (this->m_shape).m_toshape0.m_basis.m_el[1].m_floats[0] * fVar5 +
                 (this->m_shape).m_toshape0.m_basis.m_el[1].m_floats[1] * fVar8);
  auVar1._0_4_ = (float)uVar6 -
                 ((float)uVar7 +
                 (this->m_shape).m_toshape0.m_basis.m_el[0].m_floats[2] * fVar9 +
                 (this->m_shape).m_toshape0.m_basis.m_el[0].m_floats[0] * fVar5 +
                 (this->m_shape).m_toshape0.m_basis.m_el[0].m_floats[1] * fVar8);
  auVar1._8_4_ = fVar4 - ((this->m_shape).m_toshape0.m_basis.m_el[2].m_floats[2] * fVar9 +
                          (this->m_shape).m_toshape0.m_basis.m_el[2].m_floats[0] * fVar5 +
                          (this->m_shape).m_toshape0.m_basis.m_el[2].m_floats[1] * fVar8 +
                         (this->m_shape).m_toshape0.m_origin.m_floats[2]);
  auVar1._12_4_ = 0;
  *(undefined1 (*) [16])(sv->w).m_floats = auVar1;
  return;
}

Assistant:

void				getsupport(const btVector3& d,sSV& sv) const
			{
				sv.d	=	d/d.length();
				sv.w	=	m_shape.Support(sv.d);
			}